

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O3

optional<toml::detail::multiline_spacer<toml::type_config>_> *
toml::detail::skip_multiline_spacer<toml::type_config>
          (optional<toml::detail::multiline_spacer<toml::type_config>_> *__return_storage_ptr__,
          location *loc,context<toml::type_config> *ctx,bool newline_found)

{
  element_type *peVar1;
  pointer puVar2;
  _Head_base<0UL,_toml::detail::scanner_base_*,_false> _Var3;
  long *plVar4;
  pointer pbVar5;
  pointer pbVar6;
  _Alloc_hider _Var7;
  bool bVar8;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  last;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar9;
  pointer pbVar10;
  scanner_storage *other;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var11;
  bool bVar12;
  multiline_spacer<toml::type_config> spacer;
  region tabs;
  string comment;
  region sp;
  region comm;
  undefined1 local_238;
  undefined1 uStack_237;
  undefined2 uStack_236;
  undefined4 uStack_234;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_230;
  scanner_base local_218;
  repeat_at_least local_210;
  optional<toml::detail::multiline_spacer<toml::type_config>_> *local_1f8;
  scanner_base *local_1f0;
  scanner_base *local_1e8;
  character local_1e0;
  undefined1 local_1d0 [16];
  _Alloc_hider local_1c0;
  undefined4 local_1a0;
  undefined1 local_168 [16];
  element_type local_158 [3];
  undefined1 local_100 [16];
  _Alloc_hider local_f0;
  undefined4 local_d0;
  region local_98;
  
  local_230.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_230.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_230.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uStack_237 = 2;
  uStack_234 = 0;
  peVar1 = (loc->source_).
           super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  last._M_current =
       (peVar1->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
       super__Vector_impl_data._M_finish +
       -(long)(peVar1->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
              super__Vector_impl_data._M_start;
  if ((uchar *)loc->location_ < last._M_current) {
    bVar8 = false;
    local_218._vptr_scanner_base = (_func_int **)&PTR__scanner_base_00555890;
    local_1e8 = (scanner_base *)&PTR__scanner_base_005559a8;
    local_1f0 = (scanner_base *)&PTR__repeat_at_least_00555b08;
    local_238 = newline_found;
    local_1f8 = __return_storage_ptr__;
    do {
      syntax::comment((sequence *)local_100,&ctx->toml_spec_);
      local_1e0.super_scanner_base._vptr_scanner_base = local_218._vptr_scanner_base;
      local_1e0.value_ = '\n';
      local_210.super_scanner_base._vptr_scanner_base = (_func_int **)local_1e8;
      local_210.length_ = 0x44ed49;
      local_210.other_.scanner_._M_t.
      super___uniq_ptr_impl<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>
      ._M_t.
      super__Tuple_impl<0UL,_toml::detail::scanner_base_*,_std::default_delete<toml::detail::scanner_base>_>
      .super__Head_base<0UL,_toml::detail::scanner_base_*,_false>._M_head_impl =
           (unique_ptr<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>
           )(__uniq_ptr_data<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>,_true,_true>
             )0x2;
      either::either<toml::detail::character,toml::detail::literal>
                ((either *)local_1d0,&local_1e0,(literal *)&local_210);
      sequence::sequence<toml::detail::sequence,toml::detail::either>
                ((sequence *)local_168,(sequence *)local_100,(either *)local_1d0);
      sequence::scan(&local_98,(sequence *)local_168,loc);
      std::vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>::
      ~vector((vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>
               *)(local_168 + 8));
      std::vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>::
      ~vector((vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>
               *)(local_1d0 + 8));
      std::vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>::
      ~vector((vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>
               *)(local_100 + 8));
      if (local_98.source_.
          super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr == (element_type *)0x0) {
        local_210.super_scanner_base._vptr_scanner_base = local_218._vptr_scanner_base;
        local_210.length_ = CONCAT71(local_210.length_._1_7_,10);
        local_1d0._0_8_ = local_1e8;
        local_1d0._8_8_ = "\r\n";
        local_1c0._M_p = (pointer)0x2;
        either::either<toml::detail::character,toml::detail::literal>
                  ((either *)local_100,(character *)&local_210,(literal *)local_1d0);
        _Var7._M_p = local_f0._M_p;
        for (p_Var11 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_100._8_8_;
            p_Var11 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Var7._M_p;
            p_Var11 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&p_Var11->_M_use_count) {
          _Var3._M_head_impl =
               (((unique_ptr<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>
                  *)&p_Var11->_vptr__Sp_counted_base)->_M_t).
               super___uniq_ptr_impl<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>
               ._M_t.
               super__Tuple_impl<0UL,_toml::detail::scanner_base_*,_std::default_delete<toml::detail::scanner_base>_>
               .super__Head_base<0UL,_toml::detail::scanner_base_*,_false>._M_head_impl;
          (*(_Var3._M_head_impl)->_vptr_scanner_base[2])((region *)local_168,_Var3._M_head_impl,loc)
          ;
          if ((element_type *)local_168._0_8_ != (element_type *)0x0) goto LAB_003bcf07;
          region::~region((region *)local_168);
        }
        region::region((region *)local_168);
LAB_003bcf07:
        std::vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>::
        ~vector((vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>
                 *)(local_100 + 8));
        pbVar6 = local_230.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        pbVar5 = local_230.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if ((element_type *)local_168._0_8_ == (element_type *)0x0) {
          local_1d0._0_8_ = local_1f0;
          local_1d0._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x1;
          local_1c0._M_p = (pointer)operator_new(0x10);
          (((unique_ptr<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>
             *)local_1c0._M_p)->_M_t).
          super___uniq_ptr_impl<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>
          ._M_t.
          super__Tuple_impl<0UL,_toml::detail::scanner_base_*,_std::default_delete<toml::detail::scanner_base>_>
          .super__Head_base<0UL,_toml::detail::scanner_base_*,_false>._M_head_impl =
               (scanner_base *)local_218._vptr_scanner_base;
          *(undefined1 *)
           &(((unique_ptr<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>
               *)((long)local_1c0._M_p + 8))->_M_t).
            super___uniq_ptr_impl<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>
            ._M_t.
            super__Tuple_impl<0UL,_toml::detail::scanner_base_*,_std::default_delete<toml::detail::scanner_base>_>
            .super__Head_base<0UL,_toml::detail::scanner_base_*,_false>._M_head_impl = 0x20;
          repeat_at_least::scan((region *)local_100,(repeat_at_least *)local_1d0,loc);
          if ((pointer)local_1c0._M_p != (pointer)0x0) {
            (**(code **)((long)*(unique_ptr<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>
                                 *)local_1c0._M_p + 8))();
          }
          if ((_func_int **)local_100._0_8_ == (_func_int **)0x0) {
            local_210.super_scanner_base._vptr_scanner_base = (_func_int **)local_1f0;
            local_210.length_ = 1;
            local_210.other_.scanner_._M_t.
            super___uniq_ptr_impl<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>
            ._M_t.
            super__Tuple_impl<0UL,_toml::detail::scanner_base_*,_std::default_delete<toml::detail::scanner_base>_>
            .super__Head_base<0UL,_toml::detail::scanner_base_*,_false>._M_head_impl =
                 (unique_ptr<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>
                  )operator_new(0x10);
            *(_func_int ***)
             local_210.other_.scanner_._M_t.
             super___uniq_ptr_impl<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>
             ._M_t.
             super__Tuple_impl<0UL,_toml::detail::scanner_base_*,_std::default_delete<toml::detail::scanner_base>_>
             .super__Head_base<0UL,_toml::detail::scanner_base_*,_false>._M_head_impl =
                 local_218._vptr_scanner_base;
            *(undefined1 *)
             &((scanner_base *)
              ((long)local_210.other_.scanner_._M_t.
                     super___uniq_ptr_impl<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_toml::detail::scanner_base_*,_std::default_delete<toml::detail::scanner_base>_>
                     .super__Head_base<0UL,_toml::detail::scanner_base_*,_false>._M_head_impl + 8))
              ->_vptr_scanner_base = 9;
            repeat_at_least::scan((region *)local_1d0,&local_210,loc);
            if (local_210.other_.scanner_._M_t.
                super___uniq_ptr_impl<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>
                ._M_t.
                super__Tuple_impl<0UL,_toml::detail::scanner_base_*,_std::default_delete<toml::detail::scanner_base>_>
                .super__Head_base<0UL,_toml::detail::scanner_base_*,_false>._M_head_impl !=
                (__uniq_ptr_data<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>,_true,_true>
                 )0x0) {
              (*(*(_func_int ***)
                  local_210.other_.scanner_._M_t.
                  super___uniq_ptr_impl<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_toml::detail::scanner_base_*,_std::default_delete<toml::detail::scanner_base>_>
                  .super__Head_base<0UL,_toml::detail::scanner_base_*,_false>._M_head_impl)[1])();
            }
            bVar12 = (_func_int **)local_1d0._0_8_ != (_func_int **)0x0;
            if (bVar12) {
              uStack_237 = 1;
              uStack_234 = local_1a0;
              bVar8 = true;
            }
            region::~region((region *)local_1d0);
          }
          else {
            uStack_237 = 0;
            uStack_234 = local_d0;
            bVar8 = true;
            bVar12 = true;
          }
          region::~region((region *)local_100);
        }
        else {
          local_238 = 1;
          if (local_230.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish !=
              local_230.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start) {
            paVar9 = &(local_230.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->field_2;
            do {
              plVar4 = (long *)(((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)(paVar9 + -1))->_M_dataplus)._M_p;
              if (paVar9 != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)plVar4) {
                operator_delete(plVar4,paVar9->_M_allocated_capacity + 1);
              }
              pbVar10 = (pointer)(paVar9 + 1);
              paVar9 = paVar9 + 2;
            } while (pbVar10 != pbVar6);
            local_230.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = pbVar5;
          }
          uStack_237 = 2;
          uStack_234 = 0;
          bVar8 = true;
          bVar12 = true;
        }
        region::~region((region *)local_168);
        region::~region(&local_98);
        if (!bVar12) break;
      }
      else {
        local_238 = 1;
        puVar2 = ((local_98.source_.
                   super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr)->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                 _M_impl.super__Vector_impl_data._M_start;
        make_string<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                  ((string *)local_168,(detail *)(puVar2 + local_98.first_),
                   (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    )(puVar2 + local_98.last_),last);
        if (((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_168._8_8_ !=
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
           (((undefined1 *)
            ((long)&(((element_type *)(local_168._0_8_ + -0x18))->
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                    super__Vector_impl_data._M_end_of_storage + 7))[local_168._8_8_] == '\n')) {
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::pop_back
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_168)
          ;
          if (((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_168._8_8_ !=
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
             (((undefined1 *)
              ((long)&(((element_type *)(local_168._0_8_ + -0x18))->
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                      super__Vector_impl_data._M_end_of_storage + 7))[local_168._8_8_] == '\r')) {
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            pop_back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_168)
            ;
          }
        }
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_230,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_168);
        uStack_237 = 2;
        uStack_234 = 0;
        if ((element_type *)local_168._0_8_ != local_158) {
          operator_delete((void *)local_168._0_8_,
                          (ulong)(local_158[0].
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start + 1));
        }
        region::~region(&local_98);
        bVar8 = true;
      }
      peVar1 = (loc->source_).
               super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr;
      last._M_current =
           (peVar1->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_finish +
           -(long)(peVar1->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                  _M_impl.super__Vector_impl_data._M_start;
    } while ((uchar *)loc->location_ < last._M_current);
    __return_storage_ptr__ = local_1f8;
    if (bVar8) {
      *(ulong *)&(local_1f8->
                 super__Optional_base<toml::detail::multiline_spacer<toml::type_config>,_false,_false>
                 )._M_payload.
                 super__Optional_payload<toml::detail::multiline_spacer<toml::type_config>,_true,_false,_false>
                 .super__Optional_payload_base<toml::detail::multiline_spacer<toml::type_config>_>.
                 _M_payload =
           CONCAT44(uStack_234,CONCAT22(uStack_236,CONCAT11(uStack_237,local_238)));
      (local_1f8->
      super__Optional_base<toml::detail::multiline_spacer<toml::type_config>,_false,_false>).
      _M_payload.
      super__Optional_payload<toml::detail::multiline_spacer<toml::type_config>,_true,_false,_false>
      .super__Optional_payload_base<toml::detail::multiline_spacer<toml::type_config>_>._M_payload.
      _M_value.comments.comments.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           local_230.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      (local_1f8->
      super__Optional_base<toml::detail::multiline_spacer<toml::type_config>,_false,_false>).
      _M_payload.
      super__Optional_payload<toml::detail::multiline_spacer<toml::type_config>,_true,_false,_false>
      .super__Optional_payload_base<toml::detail::multiline_spacer<toml::type_config>_>._M_payload.
      _M_value.comments.comments.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           local_230.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      (local_1f8->
      super__Optional_base<toml::detail::multiline_spacer<toml::type_config>,_false,_false>).
      _M_payload.
      super__Optional_payload<toml::detail::multiline_spacer<toml::type_config>,_true,_false,_false>
      .super__Optional_payload_base<toml::detail::multiline_spacer<toml::type_config>_>._M_payload.
      _M_value.comments.comments.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           local_230.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      local_230.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_230.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_230.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      bVar8 = true;
    }
    else {
      bVar8 = false;
    }
  }
  else {
    bVar8 = false;
  }
  (__return_storage_ptr__->
  super__Optional_base<toml::detail::multiline_spacer<toml::type_config>,_false,_false>)._M_payload.
  super__Optional_payload<toml::detail::multiline_spacer<toml::type_config>,_true,_false,_false>.
  super__Optional_payload_base<toml::detail::multiline_spacer<toml::type_config>_>._M_engaged =
       bVar8;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_230);
  return __return_storage_ptr__;
}

Assistant:

cxx::optional<multiline_spacer<TC>>
skip_multiline_spacer(location& loc, context<TC>& ctx, const bool newline_found = false)
{
    const auto& spec = ctx.toml_spec();

    multiline_spacer<TC> spacer;
    spacer.newline_found = newline_found;
    spacer.indent_type   = indent_char::none;
    spacer.indent        = 0;
    spacer.comments.clear();

    bool spacer_found = false;
    while( ! loc.eof())
    {
        if(auto comm = sequence(syntax::comment(spec), syntax::newline(spec)).scan(loc))
        {
            spacer.newline_found = true;
            auto comment = comm.as_string();
            if( ! comment.empty() && comment.back() == '\n')
            {
                comment.pop_back();
                if (!comment.empty() && comment.back() == '\r')
                {
                    comment.pop_back();
                }
            }

            spacer.comments.push_back(std::move(comment));
            spacer.indent_type = indent_char::none;
            spacer.indent = 0;
            spacer_found = true;
        }
        else if(auto nl = syntax::newline(spec).scan(loc))
        {
            spacer.newline_found = true;
            spacer.comments.clear();
            spacer.indent_type = indent_char::none;
            spacer.indent = 0;
            spacer_found = true;
        }
        else if(auto sp = repeat_at_least(1, character(cxx::bit_cast<location::char_type>(' '))).scan(loc))
        {
            spacer.indent_type = indent_char::space;
            spacer.indent      = static_cast<std::int32_t>(sp.length());
            spacer_found = true;
        }
        else if(auto tabs = repeat_at_least(1, character(cxx::bit_cast<location::char_type>('\t'))).scan(loc))
        {
            spacer.indent_type = indent_char::tab;
            spacer.indent      = static_cast<std::int32_t>(tabs.length());
            spacer_found = true;
        }
        else
        {
            break; // done
        }
    }
    if( ! spacer_found)
    {
        return cxx::make_nullopt();
    }
    return spacer;
}